

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void generic_mixed_endian(void)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint16_t uVar5;
  uint3 uVar6;
  uint32_t val;
  uint64_t val_01;
  undefined1 uVar13;
  undefined1 uVar14;
  char cVar15;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int32_t val_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int64_t val_02;
  undefined1 auVar12 [16];
  uint8_t buf [2];
  undefined8 local_38;
  undefined1 local_2c [8];
  float local_24;
  double local_20;
  ulong uVar7;
  
  iVar2 = greatest_pre_test("generic_mixed_endian_u16_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u16_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar5 = CONCAT11((char)lVar4 + '\x01',(char)lVar4);
      pack_le_u16(local_2c,uVar5);
      unpack_be_u16((uint16_t *)&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x285;
      if ((uint16_t)local_38 != uVar5) {
        pack_be_u16(local_2c,uVar5);
        unpack_le_u16((uint16_t *)&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x288;
        if ((uint16_t)local_38 != uVar5) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00104b19;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00104b19:
    greatest_post_test("generic_mixed_endian_u16_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_i16_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i16_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar5 = CONCAT11((char)lVar4 + '\x01',(char)lVar4);
      pack_le_i16(local_2c,uVar5);
      unpack_be_i16((int16_t *)&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x293;
      if ((uint16_t)local_38 != uVar5) {
        pack_be_i16(local_2c,uVar5);
        unpack_le_i16((int16_t *)&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x296;
        if ((uint16_t)local_38 != uVar5) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00104c20;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00104c20:
    greatest_post_test("generic_mixed_endian_i16_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_u32_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u32_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar13 = (undefined1)((ulong)lVar4 >> 0x10);
      uVar14 = (undefined1)((ulong)lVar4 >> 0x18);
      auVar8[7] = uVar14;
      auVar8[6] = uVar14;
      auVar8[5] = uVar13;
      auVar8[4] = uVar13;
      uVar13 = (undefined1)((ulong)lVar4 >> 8);
      auVar8[3] = uVar13;
      auVar8[2] = uVar13;
      auVar8[0] = (undefined1)lVar4;
      auVar8[1] = auVar8[0];
      auVar8._8_8_ = 0;
      auVar8 = pshuflw(auVar8,auVar8,0);
      val = CONCAT13(auVar8[3] + '\x03',
                     CONCAT12(auVar8[2] + '\x02',CONCAT11(auVar8[1] + '\x01',auVar8[0])));
      pack_le_u32(local_2c,val);
      unpack_be_u32((uint32_t *)&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x2a1;
      if (CONCAT22(local_38._2_2_,(uint16_t)local_38) != val) {
        pack_be_u32(local_2c,val);
        unpack_le_u32((uint32_t *)&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x2a4;
        if (CONCAT22(local_38._2_2_,(uint16_t)local_38) != val) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00104d27;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00104d27:
    greatest_post_test("generic_mixed_endian_u32_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_i32_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i32_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar13 = (undefined1)((ulong)lVar4 >> 0x10);
      uVar14 = (undefined1)((ulong)lVar4 >> 0x18);
      auVar9[7] = uVar14;
      auVar9[6] = uVar14;
      auVar9[5] = uVar13;
      auVar9[4] = uVar13;
      uVar13 = (undefined1)((ulong)lVar4 >> 8);
      auVar9[3] = uVar13;
      auVar9[2] = uVar13;
      auVar9[0] = (undefined1)lVar4;
      auVar9[1] = auVar9[0];
      auVar9._8_8_ = 0;
      auVar8 = pshuflw(auVar9,auVar9,0);
      val_00 = CONCAT13(auVar8[3] + '\x03',
                        CONCAT12(auVar8[2] + '\x02',CONCAT11(auVar8[1] + '\x01',auVar8[0])));
      pack_le_i32(local_2c,val_00);
      unpack_be_i32((int32_t *)&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x2af;
      if (CONCAT22(local_38._2_2_,(uint16_t)local_38) != val_00) {
        pack_be_i32(local_2c,val_00);
        unpack_le_i32((int32_t *)&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x2b2;
        if (CONCAT22(local_38._2_2_,(uint16_t)local_38) != val_00) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00104e2e;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00104e2e:
    greatest_post_test("generic_mixed_endian_i32_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_u64_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u64_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar13 = (undefined1)((ulong)lVar4 >> 0x10);
      uVar14 = (undefined1)((ulong)lVar4 >> 0x18);
      auVar10[7] = uVar14;
      auVar10[6] = uVar14;
      auVar10[5] = uVar13;
      auVar10[4] = uVar13;
      uVar13 = (undefined1)((ulong)lVar4 >> 8);
      auVar10[3] = uVar13;
      auVar10[2] = uVar13;
      auVar10[0] = (undefined1)lVar4;
      auVar10[1] = auVar10[0];
      auVar10._8_8_ = 0;
      auVar8 = pshuflw(auVar10,auVar10,0);
      val_01 = CONCAT17(auVar8[7] + '\a',
                        CONCAT16(auVar8[6] + '\x06',
                                 CONCAT15(auVar8[5] + '\x05',
                                          CONCAT14(auVar8[4] + '\x04',
                                                   CONCAT13(auVar8[3] + '\x03',
                                                            CONCAT12(auVar8[2] + '\x02',
                                                                     CONCAT11(auVar8[1] + '\x01',
                                                                              auVar8[0])))))));
      pack_le_u64(local_2c,val_01);
      unpack_be_u64(&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x2bd;
      if (CONCAT44(local_38._4_4_,CONCAT22(local_38._2_2_,(uint16_t)local_38)) != val_01) {
        pack_be_u64(local_2c,val_01);
        unpack_le_u64(&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x2c0;
        if (CONCAT44(local_38._4_4_,CONCAT22(local_38._2_2_,(uint16_t)local_38)) != val_01) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00104f38;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00104f38:
    greatest_post_test("generic_mixed_endian_u64_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_i64_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i64_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar13 = (undefined1)((ulong)lVar4 >> 0x10);
      uVar14 = (undefined1)((ulong)lVar4 >> 0x18);
      auVar11[7] = uVar14;
      auVar11[6] = uVar14;
      auVar11[5] = uVar13;
      auVar11[4] = uVar13;
      uVar13 = (undefined1)((ulong)lVar4 >> 8);
      auVar11[3] = uVar13;
      auVar11[2] = uVar13;
      auVar11[0] = (undefined1)lVar4;
      auVar11[1] = auVar11[0];
      auVar11._8_8_ = 0;
      auVar8 = pshuflw(auVar11,auVar11,0);
      val_02 = CONCAT17(auVar8[7] + '\a',
                        CONCAT16(auVar8[6] + '\x06',
                                 CONCAT15(auVar8[5] + '\x05',
                                          CONCAT14(auVar8[4] + '\x04',
                                                   CONCAT13(auVar8[3] + '\x03',
                                                            CONCAT12(auVar8[2] + '\x02',
                                                                     CONCAT11(auVar8[1] + '\x01',
                                                                              auVar8[0])))))));
      pack_le_i64(local_2c,val_02);
      unpack_be_i64(&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x2cb;
      if (CONCAT44(local_38._4_4_,CONCAT22(local_38._2_2_,(uint16_t)local_38)) != val_02) {
        pack_be_i64(local_2c,val_02);
        unpack_le_i64(&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x2ce;
        if (CONCAT44(local_38._4_4_,CONCAT22(local_38._2_2_,(uint16_t)local_38)) != val_02) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00105042;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00105042:
    greatest_post_test("generic_mixed_endian_i64_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_f_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_f_should_not_match");
    }
  }
  else {
    iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar2 == 0) {
      lVar4 = random();
      uVar13 = (undefined1)((ulong)lVar4 >> 0x10);
      uVar14 = (undefined1)((ulong)lVar4 >> 0x18);
      auVar12[7] = uVar14;
      auVar12[6] = uVar14;
      auVar12[5] = uVar13;
      auVar12[4] = uVar13;
      uVar13 = (undefined1)((ulong)lVar4 >> 8);
      auVar12[3] = uVar13;
      auVar12[2] = uVar13;
      auVar12[0] = (undefined1)lVar4;
      auVar12[1] = auVar12[0];
      auVar12._8_8_ = 0;
      auVar8 = pshuflw(auVar12,auVar12,0);
      uVar6 = CONCAT12(auVar8[2] + '\x02',CONCAT11(auVar8[1] + '\x01',auVar8[0]));
      cVar15 = auVar8[7] + '\a';
      uVar7 = CONCAT17(cVar15,CONCAT16(auVar8[6] + '\x06',
                                       CONCAT15(auVar8[5] + '\x05',
                                                CONCAT14(auVar8[4] + '\x04',
                                                         CONCAT13(auVar8[3] + '\x03',uVar6)))));
      if (cVar15 < '\0') {
        local_24 = (float)((ulong)(uVar6 & 1) | uVar7 >> 1);
        local_24 = local_24 + local_24;
      }
      else {
        local_24 = (float)(long)uVar7;
      }
      pack_le_f(local_2c,local_24);
      unpack_be_f((float *)&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar3 = 0x2d9;
      if (((float)CONCAT22(local_38._2_2_,(uint16_t)local_38) != local_24) ||
         (NAN((float)CONCAT22(local_38._2_2_,(uint16_t)local_38)) || NAN(local_24))) {
        pack_be_f(local_2c,local_24);
        unpack_le_f((float *)&local_38,local_2c);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar3 = 0x2dc;
        if (((float)CONCAT22(local_38._2_2_,(uint16_t)local_38) != local_24) ||
           (NAN((float)CONCAT22(local_38._2_2_,(uint16_t)local_38)) || NAN(local_24))) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_00105191;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar2 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar3;
    }
LAB_00105191:
    greatest_post_test("generic_mixed_endian_f_should_not_match",iVar2);
  }
  iVar2 = greatest_pre_test("generic_mixed_endian_d_should_not_match");
  if (iVar2 == 0) {
    if ((greatest_info.flags & 2) == 0) {
      return;
    }
    fprintf(_stdout,"  %s\n","generic_mixed_endian_d_should_not_match");
    return;
  }
  iVar2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar2 == 0) {
    lVar4 = random();
    local_20 = (double)((float)lVar4 * 4.656613e-10);
    pack_le_d(local_2c,local_20);
    unpack_be_d((double *)&local_38,local_2c);
    greatest_info.assertions = greatest_info.assertions + 1;
    dVar1 = (double)CONCAT44(local_38._4_4_,CONCAT22(local_38._2_2_,(uint16_t)local_38));
    uVar3 = 0x2e7;
    if ((dVar1 != local_20) || (NAN(dVar1) || NAN(local_20))) {
      pack_be_d(local_2c,local_20);
      unpack_le_d((double *)&local_38,local_2c);
      greatest_info.assertions = greatest_info.assertions + 1;
      dVar1 = (double)CONCAT44(local_38._4_4_,CONCAT22(local_38._2_2_,(uint16_t)local_38));
      uVar3 = 0x2ea;
      if ((dVar1 != local_20) || (NAN(dVar1) || NAN(local_20))) {
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
        goto LAB_00105281;
      }
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    iVar2 = -1;
    greatest_info.msg = "wrote == unpack";
    greatest_info.fail_line = uVar3;
  }
LAB_00105281:
  greatest_post_test("generic_mixed_endian_d_should_not_match",iVar2);
  return;
}

Assistant:

SUITE(generic_mixed_endian) {
    RUN_TEST(generic_mixed_endian_u16_should_not_match);
    RUN_TEST(generic_mixed_endian_i16_should_not_match);
    RUN_TEST(generic_mixed_endian_u32_should_not_match);
    RUN_TEST(generic_mixed_endian_i32_should_not_match);
    RUN_TEST(generic_mixed_endian_u64_should_not_match);
    RUN_TEST(generic_mixed_endian_i64_should_not_match);
    RUN_TEST(generic_mixed_endian_f_should_not_match);
    RUN_TEST(generic_mixed_endian_d_should_not_match);
}